

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O2

void __thiscall boost::uuids::detail::sha1::get_digest(sha1 *this,digest_type *digest)

{
  size_t sVar1;
  ulong uVar2;
  
  process_byte_impl(this,0x80);
  uVar2 = this->block_byte_index_;
  if (uVar2 < 0x39) {
    while (uVar2 < 0x38) {
      process_byte_impl(this,'\0');
      uVar2 = this->block_byte_index_;
    }
  }
  else {
    sVar1 = 1;
    while (sVar1 != 0) {
      process_byte_impl(this,'\0');
      sVar1 = this->block_byte_index_;
    }
    uVar2 = 0;
    while (uVar2 < 0x38) {
      process_byte_impl(this,'\0');
      uVar2 = this->block_byte_index_;
    }
  }
  process_byte_impl(this,*(uchar *)((long)&this->bit_count_high + 3));
  process_byte_impl(this,*(uchar *)((long)&this->bit_count_high + 2));
  process_byte_impl(this,*(uchar *)((long)&this->bit_count_high + 1));
  process_byte_impl(this,(uchar)this->bit_count_high);
  process_byte_impl(this,*(uchar *)((long)&this->bit_count_low + 3));
  process_byte_impl(this,*(uchar *)((long)&this->bit_count_low + 2));
  process_byte_impl(this,*(uchar *)((long)&this->bit_count_low + 1));
  process_byte_impl(this,(uchar)this->bit_count_low);
  (*digest)[0] = this->h_[0];
  (*digest)[1] = this->h_[1];
  (*digest)[2] = this->h_[2];
  (*digest)[3] = this->h_[3];
  (*digest)[4] = this->h_[4];
  return;
}

Assistant:

inline void sha1::get_digest(digest_type& digest)
{
    // append the bit '1' to the message
    process_byte_impl(0x80);

    // append k bits '0', where k is the minimum number >= 0
    // such that the resulting message length is congruent to 56 (mod 64)
    // check if there is enough space for padding and bit_count
    if (block_byte_index_ > 56) {
        // finish this block
        while (block_byte_index_ != 0) {
            process_byte_impl(0);
        }

        // one more block
        while (block_byte_index_ < 56) {
            process_byte_impl(0);
        }
    } else {
        while (block_byte_index_ < 56) {
            process_byte_impl(0);
        }
    }

    // append length of message (before pre-processing)
    // as a 64-bit big-endian integer
    process_byte_impl( static_cast<unsigned char>((bit_count_high>>24) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_high>>16) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_high>>8 ) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_high)     & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low>>24) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low>>16) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low>>8 ) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low)     & 0xFF) );

    // get final digest
    digest[0] = h_[0];
    digest[1] = h_[1];
    digest[2] = h_[2];
    digest[3] = h_[3];
    digest[4] = h_[4];
}